

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiffReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::TextDiffReporter::report(TextDiffReporter *this,string *received,string *approved)

{
  Reporter *pRVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  poVar4 = this->stream_;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Comparing files:",0x10);
  ::std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  ::std::ostream::put((char)poVar4);
  ::std::ostream::flush();
  poVar4 = this->stream_;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"received: ",10);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(received->_M_dataplus)._M_p,received->_M_string_length);
  ::std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  ::std::ostream::put((char)poVar4);
  ::std::ostream::flush();
  poVar4 = this->stream_;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"approved: ",10);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(approved->_M_dataplus)._M_p,approved->_M_string_length);
  ::std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  ::std::ostream::put((char)poVar4);
  ::std::ostream::flush();
  pRVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>
           .super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl;
  pcVar2 = (received->_M_dataplus)._M_p;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + received->_M_string_length);
  pcVar2 = (approved->_M_dataplus)._M_p;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + approved->_M_string_length);
  iVar3 = (*pRVar1->_vptr_Reporter[2])(pRVar1,local_50,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (SUB41(iVar3,0) == false) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              (this->stream_,"TextDiffReporter did not find a working diff program\n\n",0x36);
  }
  return SUB41(iVar3,0);
}

Assistant:

bool TextDiffReporter::report(std::string received, std::string approved) const
    {
        stream_ << "Comparing files:" << std::endl;
        stream_ << "received: " << received << std::endl;
        stream_ << "approved: " << approved << std::endl;
        const bool result = m_reporter->report(received, approved);
        if (!result)
        {
            stream_ << "TextDiffReporter did not find a working diff "
                       "program\n\n";
        }

        return result;
    }